

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O0

void __thiscall Sandbox::renderDone(Sandbox *this)

{
  bool bVar1;
  allocator local_d1;
  string local_d0;
  string local_b0;
  int local_8c;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  allocator local_31;
  string local_30;
  Sandbox *local_10;
  Sandbox *this_local;
  
  local_10 = this;
  bVar1 = Tracker::isRunning(&(this->uniforms).tracker);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_30,"update:post_render",&local_31);
    Tracker::begin(&(this->uniforms).tracker,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  bVar1 = isRecording();
  if (bVar1) {
    local_8c = getRecordingCount();
    vera::toString<int>(&local_88,&local_8c,0,5,'0');
    std::operator+(&local_68,&local_88,".png");
    onScreenshot(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    recordingFrameAdded();
  }
  else {
    bVar1 = std::operator!=(&this->screenshotFile,"");
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_b0,(string *)&this->screenshotFile);
      onScreenshot(this,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::operator=((string *)&this->screenshotFile,"");
    }
  }
  unflagChange(this);
  if (this->m_plot != PLOT_OFF) {
    onPlot(this);
  }
  if ((this->m_initialized & 1U) == 0) {
    this->m_initialized = true;
    vera::updateViewport();
    flagChange(this);
  }
  bVar1 = Tracker::isRunning(&(this->uniforms).tracker);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"update:post_render",&local_d1);
    Tracker::end(&(this->uniforms).tracker,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  return;
}

Assistant:

void Sandbox::renderDone() {
    TRACK_BEGIN("update:post_render")

    // RECORD
    if (isRecording()) {
        onScreenshot( vera::toString( getRecordingCount() , 0, 5, '0') + ".png");
        recordingFrameAdded();
    }
    // SCREENSHOT 
    else if (screenshotFile != "") {
        onScreenshot(screenshotFile);
        screenshotFile = "";
    }

    unflagChange();

    if (m_plot != PLOT_OFF)
        onPlot();

    if (!m_initialized) {
        m_initialized = true;
        vera::updateViewport();
        flagChange();
    }

    TRACK_END("update:post_render")
}